

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture1D::Texture1D(Texture1D *this,TextureFormat *format,int width)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int width_local;
  TextureFormat *format_local;
  Texture1D *this_local;
  
  iVar1 = computeMipPyramidLevels(width);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_width = width;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture1DView::Texture1DView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

Texture1D::Texture1D (const TextureFormat& format, int width)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(width))
	, m_width				(width)
	, m_view				(getNumLevels(), getLevels())
{
}